

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

int Lpk_NodeCutsOneDominance(Lpk_Cut_t *pDom,Lpk_Cut_t *pCut)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    if (uVar1 == (*(uint *)pDom & 0x3f)) {
      return 1;
    }
    uVar2 = 0;
    while( true ) {
      if ((*(uint *)pCut & 0x3f) == uVar2) {
        return 0;
      }
      if (pDom->pLeaves[uVar1] == pCut->pLeaves[uVar2]) break;
      uVar2 = uVar2 + 1;
    }
    uVar1 = uVar1 + 1;
  } while ((*(uint *)pCut & 0x3f) != (uint)uVar2);
  return 0;
}

Assistant:

static inline int Lpk_NodeCutsOneDominance( Lpk_Cut_t * pDom, Lpk_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < (int)pDom->nLeaves; i++ )
    {
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            if ( pDom->pLeaves[i] == pCut->pLeaves[k] )
                break;
        if ( k == (int)pCut->nLeaves ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}